

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

void timestamp(void)

{
  int iVar1;
  rep rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> milliseconds;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration time;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_10;
  
  if (timestamp()::prev == '\0') {
    iVar1 = __cxa_guard_acquire(&timestamp()::prev);
    if (iVar1 != 0) {
      local_10.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      timestamp::prev =
           std::chrono::
           time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           ::time_since_epoch(&local_10);
      __cxa_guard_release(&timestamp()::prev);
    }
  }
  milliseconds.__r = std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&milliseconds);
  local_40.__r = (rep)std::chrono::operator-(&local_28,&timestamp::prev);
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_40);
  timestamp::prev.__r = local_28.__r;
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
  printf("%lli: ",rVar2);
  return;
}

Assistant:

inline void timestamp() {
  static auto prev = std::chrono::system_clock::now().time_since_epoch();

  auto time = std::chrono::system_clock::now().time_since_epoch();
  auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(time - prev);
  prev = time;

  printf("%lli: ", milliseconds.count());
}